

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountPtr.h
# Opt level: O2

RefCountPtr<MyClass> * __thiscall
RefCountPtr<MyClass>::operator=(RefCountPtr<MyClass> *this,MyClass *inValue)

{
  if (this->mValue != (MyClass *)0x0) {
    RefCountObject::Release(&this->mValue->super_RefCountObject);
  }
  this->mValue = inValue;
  if (inValue != (MyClass *)0x0) {
    RefCountObject::AddRef(&inValue->super_RefCountObject);
  }
  return this;
}

Assistant:

RefCountPtr<T>&  RefCountPtr<T>::operator =(T* inValue)
{
	if(mValue)
		mValue->Release();
	mValue = inValue;
	if(mValue)
		mValue->AddRef();
	return *this;
}